

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFileBaseNameArtifact<ArtifactNameTag>::Evaluate
          (string *__return_storage_ptr__,TargetFileBaseNameArtifact<ArtifactNameTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  undefined1 local_60 [8];
  string result;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetFileBaseNameArtifact<ArtifactNameTag> *this_local;
  
  result.field_2._8_8_ =
       TargetArtifactBase::GetTarget
                 (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if ((cmGeneratorTarget *)result.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    TargetOutputNameArtifactResultGetter<ArtifactNameTag>::Get_abi_cxx11_
              ((string *)local_60,
               (TargetOutputNameArtifactResultGetter<ArtifactNameTag> *)result.field_2._8_8_,
               (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,
               (GeneratorExpressionContent *)dagChecker);
    if ((context->HadError & 1U) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_60);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }

    std::string result = TargetOutputNameArtifactResultGetter<ArtifactT>::Get(
      target, context, content);
    if (context->HadError) {
      return std::string();
    }
    return result;
  }